

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O3

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,2ul>,int,int>
               (SmallVector<(anonymous_namespace)::Constructable,_2UL> *v,int *args,int *args_1)

{
  int iVar1;
  undefined1 uVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  StringRef capturedExpression;
  StringRef macroName;
  array<int,_2UL> a;
  AssertionHandler catchAssertionHandler;
  int local_68 [2];
  ITransientExpression local_60;
  AssertionHandler local_50;
  
  local_68[0] = (int)args;
  local_68[1] = (int)args_1;
  local_60._vptr_ITransientExpression = (_func_int **)0xa004f0;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  capturedExpression.m_size = 0x36;
  capturedExpression.m_start = "std::ranges::equal(v, a, {}, &Constructable::getValue)";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_50,macroName,(SourceLineInfo *)&local_60,capturedExpression,ContinueOnFailure);
  if ((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len == 2) {
    piVar3 = local_68;
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)&((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).
                              data_)->value + lVar4);
      iVar5 = -iVar1;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
      if (iVar5 != *piVar3) goto LAB_00537fb2;
      piVar3 = piVar3 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x10);
    uVar2 = 1;
  }
  else {
LAB_00537fb2:
    uVar2 = 0;
  }
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c896a0;
  local_60._8_8_ = (ulong)CONCAT52(local_60._11_5_,CONCAT11(uVar2,uVar2)) << 8;
  Catch::AssertionHandler::handleExpr(&local_50,&local_60);
  Catch::AssertionHandler::complete(&local_50);
  if (local_50.m_completed == false) {
    (*(local_50.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}